

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_disrupt_vision(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  long in_RCX;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff94;
  CHAR_DATA *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  
  bVar1 = is_affected_by(in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  if ((!bVar1) &&
     (bVar1 = saves_spell(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                          in_stack_ffffffffffffff94), !bVar1)) {
    in_stack_ffffffffffffff68 = *(CHAR_DATA **)(in_RCX + 0x180);
    _Var2 = std::pow<int,int>(0,0x6d8c64);
    if (((ulong)in_stack_ffffffffffffff68 & (long)_Var2) == 0) {
      ch_00 = *(CHAR_DATA **)(in_RCX + 0x280);
      _Var2 = std::pow<int,int>(0,0x6d8c9a);
      if (((ulong)ch_00 & (long)_Var2) == 0) {
        init_affect((AFFECT_DATA *)0x6d8ce4);
        get_spell_aftype(in_stack_ffffffffffffff58);
        std::pow<int,int>(0,0x6d8d42);
        affect_to_char(ch_00,(AFFECT_DATA *)in_stack_ffffffffffffff58);
        send_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        act(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,ch_00,in_stack_ffffffffffffff58,0);
        return;
      }
    }
  }
  send_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  send_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void spell_disrupt_vision(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected_by(victim, AFF_BLIND)
		|| saves_spell(level, victim, DAM_ENERGY)
		|| IS_SET(victim->act, ACT_UNDEAD)
		|| IS_SET(victim->form, FORM_UNDEAD))
	{
		send_to_char("Spell failed.\n\r", ch);
		send_to_char("Slight flickering briefly obscures your vision but then subsides.\n\r", victim);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 12;

	SET_BIT(af.bitvector, AFF_BLIND);

	af.mod_name = MOD_VISION;
	affect_to_char(victim, &af);

	send_to_char("A white flash blankets your field of vision, and you cannot see anything!\n\r", victim);
	act("$n appears to be blinded.", victim, nullptr, nullptr, TO_ROOM);
}